

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NewParseTest.cpp
# Opt level: O2

Option * add_option(App *app,string *name,cx *variable,string *description,bool defaulted)

{
  Option *this;
  _Any_data local_268;
  code *local_258;
  code *local_250;
  string local_248 [32];
  string local_228;
  string local_208;
  function<bool_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>)>
  local_1e8;
  string local_1c8;
  stringstream out;
  ostream local_198 [376];
  
  local_268._8_8_ = 0;
  local_250 = CLI::std::
              _Function_handler<bool_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/NewParseTest.cpp:11:27)>
              ::_M_invoke;
  local_258 = CLI::std::
              _Function_handler<bool_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/NewParseTest.cpp:11:27)>
              ::_M_manager;
  local_268._M_unused._M_object = variable;
  std::__cxx11::string::string((string *)&local_1c8,(string *)name);
  CLI::std::
  function<bool_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>)>
  ::function(&local_1e8,
             (function<bool_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>)>
              *)&local_268);
  std::__cxx11::string::string((string *)&local_208,(string *)description);
  this = CLI::App::add_option(app,&local_1c8,&local_1e8,&local_208,defaulted);
  std::__cxx11::string::~string((string *)&local_208);
  CLI::std::_Function_base::~_Function_base(&local_1e8.super__Function_base);
  std::__cxx11::string::~string((string *)&local_1c8);
  std::__cxx11::string::string((string *)&local_228,"COMPLEX",(allocator *)&out);
  CLI::Option::set_custom_option(this,&local_228,2);
  std::__cxx11::string::~string((string *)&local_228);
  if (defaulted) {
    std::__cxx11::stringstream::stringstream((stringstream *)&out);
    std::operator<<(local_198,(complex *)variable);
    std::__cxx11::stringbuf::str();
    std::__cxx11::string::_M_assign((string *)&this->defaultval_);
    std::__cxx11::string::~string(local_248);
    std::__cxx11::stringstream::~stringstream((stringstream *)&out);
  }
  CLI::std::_Function_base::~_Function_base((_Function_base *)&local_268);
  return this;
}

Assistant:

CLI::Option *
add_option(CLI::App &app, std::string name, cx &variable, std::string description = "", bool defaulted = false) {
    CLI::callback_t fun = [&variable](CLI::results_t res) {
        double x, y;
        bool worked = CLI::detail::lexical_cast(res[0], x) && CLI::detail::lexical_cast(res[1], y);
        if(worked)
            variable = cx(x, y);
        return worked;
    };

    CLI::Option *opt = app.add_option(name, fun, description, defaulted);
    opt->set_custom_option("COMPLEX", 2);
    if(defaulted) {
        std::stringstream out;
        out << variable;
        opt->set_default_str(out.str());
    }
    return opt;
}